

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

void xmlNextChar(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  byte *pbVar3;
  ulong uVar4;
  
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (pxVar2 = ctxt->input, pxVar2 != (xmlParserInputPtr)0x0)) {
    pbVar3 = pxVar2->cur;
    uVar4 = (long)pxVar2->end - (long)pbVar3;
    if (uVar4 < 0xfa) {
      xmlParserGrow(ctxt);
      pxVar2 = ctxt->input;
      pbVar3 = pxVar2->cur;
      if (pxVar2->end <= pbVar3) {
        return;
      }
      uVar4 = (long)pxVar2->end - (long)pbVar3;
    }
    bVar1 = *pbVar3;
    if ((char)bVar1 < '\0') {
      pxVar2->col = pxVar2->col + 1;
      if ((((uVar4 < 2) || ((pbVar3[1] & 0xc0) != 0x80)) || (0xdf < bVar1)) || (bVar1 < 0xc2)) {
        if ((pxVar2->flags & 0x20) == 0) {
          xmlCtxtErrIO(ctxt,0x51,(char *)0x0);
          pxVar2 = ctxt->input;
          pxVar2->flags = pxVar2->flags | 0x20;
          pbVar3 = pxVar2->cur;
        }
        pbVar3 = pbVar3 + 1;
      }
      else {
        pbVar3 = pbVar3 + 2;
      }
      pxVar2->cur = pbVar3;
    }
    else {
      if (bVar1 == 0xd) {
        pbVar3 = pbVar3 + (ulong)(pbVar3[1] == 10) + 1;
      }
      else {
        pbVar3 = pbVar3 + 1;
        if (bVar1 != 10) {
          pxVar2->cur = pbVar3;
          pxVar2->col = pxVar2->col + 1;
          return;
        }
      }
      pxVar2->cur = pbVar3;
      pxVar2->line = pxVar2->line + 1;
      pxVar2->col = 1;
    }
  }
  return;
}

Assistant:

void
xmlNextChar(xmlParserCtxtPtr ctxt)
{
    const unsigned char *cur;
    size_t avail;
    int c;

    if ((ctxt == NULL) || (ctxt->input == NULL))
        return;

    avail = ctxt->input->end - ctxt->input->cur;

    if (avail < INPUT_CHUNK) {
        xmlParserGrow(ctxt);
        if (ctxt->input->cur >= ctxt->input->end)
            return;
        avail = ctxt->input->end - ctxt->input->cur;
    }

    cur = ctxt->input->cur;
    c = *cur;

    if (c < 0x80) {
        if (c == '\n') {
            ctxt->input->cur++;
            ctxt->input->line++;
            ctxt->input->col = 1;
        } else if (c == '\r') {
            /*
             *   2.11 End-of-Line Handling
             *   the literal two-character sequence "#xD#xA" or a standalone
             *   literal #xD, an XML processor must pass to the application
             *   the single character #xA.
             */
            ctxt->input->cur += ((cur[1] == '\n') ? 2 : 1);
            ctxt->input->line++;
            ctxt->input->col = 1;
            return;
        } else {
            ctxt->input->cur++;
            ctxt->input->col++;
        }
    } else {
        ctxt->input->col++;

        if ((avail < 2) || (cur[1] & 0xc0) != 0x80)
            goto encoding_error;

        if (c < 0xe0) {
            /* 2-byte code */
            if (c < 0xc2)
                goto encoding_error;
            ctxt->input->cur += 2;
        } else {
            unsigned int val = (c << 8) | cur[1];

            if ((avail < 3) || (cur[2] & 0xc0) != 0x80)
                goto encoding_error;

            if (c < 0xf0) {
                /* 3-byte code */
                if ((val < 0xe0a0) || ((val >= 0xeda0) && (val < 0xee00)))
                    goto encoding_error;
                ctxt->input->cur += 3;
            } else {
                if ((avail < 4) || ((cur[3] & 0xc0) != 0x80))
                    goto encoding_error;

                /* 4-byte code */
                if ((val < 0xf090) || (val >= 0xf490))
                    goto encoding_error;
                ctxt->input->cur += 4;
            }
        }
    }

    return;

encoding_error:
    /* Only report the first error */
    if ((ctxt->input->flags & XML_INPUT_ENCODING_ERROR) == 0) {
        xmlCtxtErrIO(ctxt, XML_ERR_INVALID_ENCODING, NULL);
        ctxt->input->flags |= XML_INPUT_ENCODING_ERROR;
    }
    ctxt->input->cur++;
}